

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int read_dns_question(question *question,char *src,char *message_start)

{
  int iVar1;
  char *src_local;
  
  src_local = src;
  iVar1 = fetch_label(question->label,src,message_start,&src_local);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    question->qclass = *(ushort *)(src_local + 2) << 8 | *(ushort *)(src_local + 2) >> 8;
    question->qtype = *(ushort *)src_local << 8 | *(ushort *)src_local >> 8;
    iVar1 = ((int)src_local - (int)src) + 1;
  }
  return iVar1;
}

Assistant:

int read_dns_question(struct question *question, char *src,
                      char *message_start) {
  char *src_ = src;
  if (fetch_label((char *)&question->label, src, message_start, &src) < 0) {
    // TODO:异常处理
    return -1;
  }
  struct question_struct *q;
  q = (struct question_struct *)src;
  question->qclass = ntohs(q->qclass);
  question->qtype = ntohs(q->qtype);
  return src - src_ + 1;
}